

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::CreateReturn(MergeReturnPass *this,BasicBlock *block)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spv::Decoration> __l;
  initializer_list<unsigned_int> init_list_00;
  uint32_t to;
  BasicBlock *pBVar1;
  uint32_t from;
  IRContext *pIVar2;
  DecorationManager *this_00;
  Instruction *pIVar3;
  Operand *local_1d8;
  Operand *local_1b8;
  Op local_1a4;
  IRContext *local_1a0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_198
  ;
  uint32_t local_18c;
  iterator local_188;
  undefined8 local_180;
  SmallVector<unsigned_int,_2UL> local_178;
  Operand local_150;
  undefined1 local_120 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_f8;
  allocator<spv::Decoration> local_ed;
  Decoration local_ec;
  iterator local_e8;
  size_type local_e0;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> local_d8;
  Instruction *local_c0;
  Instruction *var_inst;
  iterator local_b0;
  undefined8 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  undefined1 local_48 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  uint32_t local_1c;
  BasicBlock *pBStack_18;
  uint32_t loadId;
  BasicBlock *block_local;
  MergeReturnPass *this_local;
  
  pBStack_18 = block;
  block_local = (BasicBlock *)this;
  AddReturnValue(this);
  pBVar1 = pBStack_18;
  if (this->return_value_ == (Instruction *)0x0) {
    local_1a0 = Pass::context((Pass *)this);
    local_1a4 = OpReturn;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op>
              ((spvtools *)&local_198,&local_1a0,&local_1a4);
    BasicBlock::AddInstruction(pBVar1,&local_198);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_198);
    pIVar2 = Pass::context((Pass *)this);
    pIVar3 = BasicBlock::terminator(pBStack_18);
    IRContext::AnalyzeDefUse(pIVar2,pIVar3);
    pIVar2 = Pass::context((Pass *)this);
    pIVar3 = BasicBlock::terminator(pBStack_18);
    IRContext::set_instr_block(pIVar2,pIVar3,pBStack_18);
  }
  else {
    local_1c = Pass::TakeNextId((Pass *)this);
    pBVar1 = pBStack_18;
    local_48._24_8_ = Pass::context((Pass *)this);
    local_48._20_4_ = 0x3d;
    local_48._16_4_ = opt::Function::type_id(this->function_);
    var_inst._4_4_ = opt::Instruction::result_id(this->return_value_);
    local_b0 = (iterator)((long)&var_inst + 4);
    local_a8 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_b0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list_00);
    Operand::Operand(&local_78,SPV_OPERAND_TYPE_ID,&local_a0);
    local_48._0_8_ = &local_78;
    local_48._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_28,(IRContext **)(local_48 + 0x18),(Op *)(local_48 + 0x14),
               (uint *)(local_48 + 0x10),&local_1c,
               (initializer_list<spvtools::opt::Operand> *)local_48);
    BasicBlock::AddInstruction(pBVar1,&local_28);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_28);
    local_1b8 = (Operand *)local_48;
    do {
      local_1b8 = local_1b8 + -1;
      Operand::~Operand(local_1b8);
    } while (local_1b8 != &local_78);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
    local_c0 = BasicBlock::terminator(pBStack_18);
    pIVar2 = Pass::context((Pass *)this);
    IRContext::AnalyzeDefUse(pIVar2,local_c0);
    pIVar2 = Pass::context((Pass *)this);
    IRContext::set_instr_block(pIVar2,local_c0,pBStack_18);
    pIVar2 = Pass::context((Pass *)this);
    this_00 = IRContext::get_decoration_mgr(pIVar2);
    from = opt::Instruction::result_id(this->return_value_);
    to = local_1c;
    local_ec = DecorationRelaxedPrecision;
    local_e8 = &local_ec;
    local_e0 = 1;
    std::allocator<spv::Decoration>::allocator(&local_ed);
    __l._M_len = local_e0;
    __l._M_array = local_e8;
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::vector(&local_d8,__l,&local_ed);
    analysis::DecorationManager::CloneDecorations(this_00,from,to,&local_d8);
    std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::~vector(&local_d8);
    std::allocator<spv::Decoration>::~allocator(&local_ed);
    pBVar1 = pBStack_18;
    local_120._32_8_ = Pass::context((Pass *)this);
    local_120[0x1c] = -2;
    local_120[0x1d] = '\0';
    local_120[0x1e] = '\0';
    local_120[0x1f] = '\0';
    local_120[0x18] = '\0';
    local_120[0x19] = '\0';
    local_120[0x1a] = '\0';
    local_120[0x1b] = '\0';
    local_120._20_4_ = 0;
    local_18c = local_1c;
    local_188 = &local_18c;
    local_180 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_188;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_178,init_list);
    Operand::Operand(&local_150,SPV_OPERAND_TYPE_ID,&local_178);
    local_120._0_8_ = &local_150;
    local_120._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_f8,(IRContext **)(local_120 + 0x20),(Op *)(local_120 + 0x1c),
               (int *)(local_120 + 0x18),(int *)(local_120 + 0x14),
               (initializer_list<spvtools::opt::Operand> *)local_120);
    BasicBlock::AddInstruction(pBVar1,&local_f8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_f8);
    local_1d8 = (Operand *)local_120;
    do {
      local_1d8 = local_1d8 + -1;
      Operand::~Operand(local_1d8);
    } while (local_1d8 != &local_150);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_178);
    pIVar2 = Pass::context((Pass *)this);
    pIVar3 = BasicBlock::terminator(pBStack_18);
    IRContext::AnalyzeDefUse(pIVar2,pIVar3);
    pIVar2 = Pass::context((Pass *)this);
    pIVar3 = BasicBlock::terminator(pBStack_18);
    IRContext::set_instr_block(pIVar2,pIVar3,pBStack_18);
  }
  return;
}

Assistant:

void MergeReturnPass::CreateReturn(BasicBlock* block) {
  AddReturnValue();

  if (return_value_) {
    // Load and return the final return value
    uint32_t loadId = TakeNextId();
    block->AddInstruction(MakeUnique<Instruction>(
        context(), spv::Op::OpLoad, function_->type_id(), loadId,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {return_value_->result_id()}}}));
    Instruction* var_inst = block->terminator();
    context()->AnalyzeDefUse(var_inst);
    context()->set_instr_block(var_inst, block);
    context()->get_decoration_mgr()->CloneDecorations(
        return_value_->result_id(), loadId,
        {spv::Decoration::RelaxedPrecision});

    block->AddInstruction(MakeUnique<Instruction>(
        context(), spv::Op::OpReturnValue, 0, 0,
        std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {loadId}}}));
    context()->AnalyzeDefUse(block->terminator());
    context()->set_instr_block(block->terminator(), block);
  } else {
    block->AddInstruction(
        MakeUnique<Instruction>(context(), spv::Op::OpReturn));
    context()->AnalyzeDefUse(block->terminator());
    context()->set_instr_block(block->terminator(), block);
  }
}